

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_bcread.c
# Opt level: O0

void bcread_fill(LexState *ls,MSize len,int need)

{
  char *pcVar1;
  uint uVar2;
  int in_EDX;
  uint in_ESI;
  long in_RDI;
  MSize n;
  char *p;
  size_t sz;
  char *buf;
  MSize in_stack_ffffffffffffff8c;
  undefined4 in_stack_ffffffffffffff90;
  uint in_stack_ffffffffffffff94;
  lua_State *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  char *local_58;
  ulong local_50;
  void *local_48;
  int local_40;
  uint local_3c;
  long local_38;
  uint local_2c;
  lua_State *local_28;
  char *local_20;
  uint local_14;
  long local_10;
  char *local_8;
  
  local_40 = in_EDX;
  local_3c = in_ESI;
  local_38 = in_RDI;
  if ((0x7fffff00 < in_ESI) || (*(int *)(in_RDI + 0x30) < 0)) {
    bcread_error((LexState *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                 (ErrMsg)((ulong)in_stack_ffffffffffffff98 >> 0x20));
  }
  do {
    local_58 = (char *)(ulong)*(uint *)(local_38 + 0x44);
    uVar2 = (int)*(undefined8 *)(local_38 + 0x28) - (int)*(undefined8 *)(local_38 + 0x20);
    if (uVar2 != 0) {
      if (*(int *)(local_38 + 0x3c) == *(int *)(local_38 + 0x44)) {
        local_10 = local_38 + 0x3c;
        local_14 = local_3c;
        if ((uint)(*(int *)(local_38 + 0x40) - *(int *)(local_38 + 0x44)) < local_3c) {
          local_8 = lj_buf_need2((SBuf *)CONCAT44(in_stack_ffffffffffffff94,
                                                  in_stack_ffffffffffffff90),
                                 in_stack_ffffffffffffff8c);
        }
        else {
          local_8 = (char *)(ulong)*(uint *)(local_38 + 0x44);
        }
        local_58 = local_8;
        memcpy(local_8,*(void **)(local_38 + 0x20),(ulong)uVar2);
      }
      else if (*(char **)(local_38 + 0x20) != local_58) {
        memmove(local_58,*(void **)(local_38 + 0x20),(ulong)uVar2);
      }
      *(char **)(local_38 + 0x20) = local_58;
      *(char **)(local_38 + 0x28) = local_58 + uVar2;
    }
    *(uint *)(local_38 + 0x3c) = (int)local_58 + uVar2;
    local_48 = (void *)(**(code **)(local_38 + 0x50))
                                 (*(undefined8 *)(local_38 + 8),*(undefined8 *)(local_38 + 0x58),
                                  &local_50);
    if ((local_48 == (void *)0x0) || (local_50 == 0)) {
      if (local_40 != 0) {
        bcread_error((LexState *)CONCAT44(uVar2,in_stack_ffffffffffffffa0),
                     (ErrMsg)((ulong)in_stack_ffffffffffffff98 >> 0x20));
      }
      *(undefined4 *)(local_38 + 0x30) = 0xffffffff;
      return;
    }
    if (0x7fffff00 - uVar2 <= local_50) {
      lj_err_mem(in_stack_ffffffffffffff98);
    }
    if (uVar2 == 0) {
      *(void **)(local_38 + 0x20) = local_48;
      *(ulong *)(local_38 + 0x28) = (long)local_48 + local_50;
    }
    else {
      uVar2 = (int)local_50 + uVar2;
      in_stack_ffffffffffffff98 = (lua_State *)(local_38 + 0x3c);
      in_stack_ffffffffffffff94 = uVar2;
      if (uVar2 < local_3c) {
        in_stack_ffffffffffffff94 = local_3c;
      }
      local_2c = in_stack_ffffffffffffff94;
      local_28 = in_stack_ffffffffffffff98;
      if ((uint)(*(int *)(local_38 + 0x40) - *(int *)(local_38 + 0x44)) < in_stack_ffffffffffffff94)
      {
        local_20 = lj_buf_need2((SBuf *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90
                                                ),in_stack_ffffffffffffff8c);
      }
      else {
        local_20 = (char *)(ulong)*(uint *)(local_38 + 0x44);
      }
      pcVar1 = local_20;
      memcpy((void *)(ulong)*(uint *)(local_38 + 0x3c),local_48,local_50);
      *(uint *)(local_38 + 0x3c) = (int)pcVar1 + uVar2;
      *(char **)(local_38 + 0x20) = pcVar1;
      *(char **)(local_38 + 0x28) = pcVar1 + uVar2;
    }
  } while ((uint)((int)*(undefined8 *)(local_38 + 0x28) - (int)*(undefined8 *)(local_38 + 0x20)) <
           local_3c);
  return;
}

Assistant:

static LJ_NOINLINE void bcread_fill(LexState *ls, MSize len, int need)
{
  lj_assertLS(len != 0, "empty refill");
  if (len > LJ_MAX_BUF || ls->c < 0)
    bcread_error(ls, LJ_ERR_BCBAD);
  do {
    const char *buf;
    size_t sz;
    char *p = sbufB(&ls->sb);
    MSize n = (MSize)(ls->pe - ls->p);
    if (n) {  /* Copy remainder to buffer. */
      if (sbuflen(&ls->sb)) {  /* Move down in buffer. */
	lj_assertLS(ls->pe == sbufP(&ls->sb), "bad buffer pointer");
	if (ls->p != p) memmove(p, ls->p, n);
      } else {  /* Copy from buffer provided by reader. */
	p = lj_buf_need(&ls->sb, len);
	memcpy(p, ls->p, n);
      }
      ls->p = p;
      ls->pe = p + n;
    }
    setsbufP(&ls->sb, p + n);
    buf = ls->rfunc(ls->L, ls->rdata, &sz);  /* Get more data from reader. */
    if (buf == NULL || sz == 0) {  /* EOF? */
      if (need) bcread_error(ls, LJ_ERR_BCBAD);
      ls->c = -1;  /* Only bad if we get called again. */
      break;
    }
    if (sz >= LJ_MAX_BUF - n) lj_err_mem(ls->L);
    if (n) {  /* Append to buffer. */
      n += (MSize)sz;
      p = lj_buf_need(&ls->sb, n < len ? len : n);
      memcpy(sbufP(&ls->sb), buf, sz);
      setsbufP(&ls->sb, p + n);
      ls->p = p;
      ls->pe = p + n;
    } else {  /* Return buffer provided by reader. */
      ls->p = buf;
      ls->pe = buf + sz;
    }
  } while ((MSize)(ls->pe - ls->p) < len);
}